

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::ClipboardImpl(ClipboardImpl *this)

{
  long lVar1;
  Display *pDVar2;
  Atom AVar3;
  undefined8 uVar4;
  undefined8 *in_RDI;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 uVar5;
  string *in_stack_fffffffffffffec8;
  string *name;
  allocator local_d9;
  string local_d8 [39];
  undefined1 local_b1 [40];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  *in_RDI = 0;
  String::String((String *)0x30e137);
  std::deque<_XEvent,_std::allocator<_XEvent>_>::deque
            ((deque<_XEvent,_std::allocator<_XEvent>_> *)0x30e150);
  *(undefined1 *)(in_RDI + 0x15) = 0;
  pDVar2 = OpenDisplay();
  in_RDI[1] = pDVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"CLIPBOARD",&local_39);
  AVar3 = getAtom(in_stack_fffffffffffffec8,(bool)uVar5);
  in_RDI[2] = AVar3;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TARGETS",&local_61);
  AVar3 = getAtom(in_stack_fffffffffffffec8,(bool)uVar5);
  in_RDI[3] = AVar3;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"TEXT",&local_89);
  AVar3 = getAtom(in_stack_fffffffffffffec8,(bool)uVar5);
  in_RDI[4] = AVar3;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  name = (string *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"UTF8_STRING",(allocator *)name);
  AVar3 = getAtom(name,(bool)uVar5);
  in_RDI[5] = AVar3;
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  uVar5 = (undefined1)(AVar3 >> 0x38);
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"SFML_CLIPBOARD_TARGET_PROPERTY",&local_d9);
  AVar3 = getAtom(name,(bool)uVar5);
  in_RDI[6] = AVar3;
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  lVar1 = in_RDI[1];
  uVar4 = XCreateSimpleWindow(lVar1,*(undefined8 *)
                                     (*(long *)(lVar1 + 0xe8) + 0x10 +
                                     (long)*(int *)(lVar1 + 0xe0) * 0x80),0,0,1,1,0,0,0);
  *in_RDI = uVar4;
  XSelectInput(in_RDI[1],*in_RDI,0x1f);
  return;
}

Assistant:

ClipboardImpl::ClipboardImpl() :
m_window (0),
m_requestResponded(false)
{
    // Open a connection with the X server
    m_display = OpenDisplay();

    // Get the atoms we need to make use of the clipboard
    m_clipboard      = getAtom("CLIPBOARD",                      false);
    m_targets        = getAtom("TARGETS",                        false);
    m_text           = getAtom("TEXT",                           false);
    m_utf8String     = getAtom("UTF8_STRING",                    true );
    m_targetProperty = getAtom("SFML_CLIPBOARD_TARGET_PROPERTY", false);

    // Create a hidden window that will broker our clipboard interactions with X
    m_window = XCreateSimpleWindow(m_display, DefaultRootWindow(m_display), 0, 0, 1, 1, 0, 0, 0);

    // Register the events we are interested in
    XSelectInput(m_display, m_window, SelectionNotify | SelectionClear | SelectionRequest);
}